

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VertexClustering::~VertexClustering(VertexClustering *this)

{
  void *pvVar1;
  VertexGroup *this_00;
  VertexGroup *pVVar2;
  reference ppVVar3;
  undefined8 *in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while( true ) {
    this_00 = (VertexGroup *)(long)local_c;
    pVVar2 = (VertexGroup *)
             std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::size
                       ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 2));
    if (pVVar2 <= this_00) break;
    ppVVar3 = std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                        ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 2),
                         (long)local_c);
    if (*ppVVar3 != (value_type)0x0) {
      (*(*ppVVar3)->_vptr_VCCluster[3])();
    }
    local_c = local_c + 1;
  }
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    VertexGroup::~VertexGroup(this_00);
    operator_delete(pvVar1);
  }
  if ((in_RDI[1] != 0) && (pvVar1 = (void *)in_RDI[1], pvVar1 != (void *)0x0)) {
    VertexGroup::~VertexGroup(this_00);
    operator_delete(pvVar1);
  }
  std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::~queue
            ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)0x280133);
  std::map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::~map
            ((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
              *)0x280141);
  std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::~vector
            ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)this_00);
  return;
}

Assistant:

VertexClustering::~VertexClustering(void)
{
	for (int i = 0; i < clusters.size(); i++)
		delete clusters[i];
	delete vGroup;
	if (vGroupNew)
		delete vGroupNew;
}